

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

PageSegmentBase<Memory::VirtualAllocWrapper> * __thiscall
DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,RealCount>::
PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,void*,unsigned_int,unsigned_int,bool>
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,RealCount> *this,
          NoThrowHeapAllocator *allocator,
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          *param1,void *param2,uint param3,uint param4,bool param5)

{
  NoThrowHeapAllocator *alloc;
  NodeBase *this_00;
  DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> **ppDVar1;
  TrackAllocData local_70;
  NodeBase *local_48;
  Node *newNode;
  uint local_38;
  uint uStack_34;
  bool param5_local;
  uint param4_local;
  uint param3_local;
  void *param2_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *param1_local;
  NoThrowHeapAllocator *allocator_local;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_local;
  
  newNode._7_1_ = param5;
  local_38 = param4;
  uStack_34 = param3;
  _param4_local = param2;
  param2_local = param1;
  param1_local = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  *)allocator;
  allocator_local = (NoThrowHeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,
             (type_info *)&DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>::typeinfo
             ,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x14b);
  alloc = Memory::NoThrowHeapAllocator::TrackAllocInfo(allocator,&local_70);
  this_00 = (NodeBase *)new<Memory::NoThrowHeapAllocator>(0x98,alloc,0x28f8d0);
  DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>::
  DListNode<Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,void*,unsigned_int,unsigned_int,bool>
            ((DListNode<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>> *)this_00,
             (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)param2_local,_param4_local,uStack_34,local_38,(bool)(newNode._7_1_ & 1));
  if (this_00 == (NodeBase *)0x0) {
    this_local = (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  }
  else {
    local_48 = this_00;
    ppDVar1 = DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>::Next
                        ((DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_> *)
                         this);
    DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::InsertNodeBefore
              (*ppDVar1,local_48);
    RealCount::IncrementCount((RealCount *)(this + 0x10));
    this_local = (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
                 (local_48 + 1);
  }
  return (PageSegmentBase<Memory::VirtualAllocWrapper> *)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3, TParam4 param4, TParam5 param5)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3, param4, param5);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }